

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitContinueStatement
          (CodegenVisitor *this,ContinueStatement *continueStmt)

{
  long stacksize;
  size_type sVar1;
  SQInteger SVar2;
  SQFuncState *pSVar3;
  ulong local_18;
  
  addLineNumber(this,(Statement *)continueStmt);
  pSVar3 = this->_fs;
  sVar1 = (pSVar3->_continuetargets)._size;
  if (sVar1 == 0) {
    reportDiagnostic(this,(Node *)continueStmt,0x26,"continue");
    pSVar3 = this->_fs;
    sVar1 = (pSVar3->_continuetargets)._size;
  }
  SVar2 = (pSVar3->_continuetargets)._vals[sVar1 - 1];
  if (0 < SVar2) {
    SQFuncState::AddInstruction(pSVar3,_OP_POPTRAP,SVar2,0,0,0);
    pSVar3 = this->_fs;
  }
  SVar2 = SQFuncState::GetStackSize(pSVar3);
  pSVar3 = this->_fs;
  stacksize = (pSVar3->_blockstacksizes)._vals[(pSVar3->_blockstacksizes)._size - 1];
  if (SVar2 != stacksize) {
    SVar2 = SQFuncState::CountOuters(pSVar3,stacksize);
    pSVar3 = this->_fs;
    if (SVar2 != 0) {
      SQFuncState::AddInstruction
                (pSVar3,_OP_CLOSE,0,
                 (pSVar3->_blockstacksizes)._vals[(pSVar3->_blockstacksizes)._size - 1],0,0);
      pSVar3 = this->_fs;
    }
  }
  SQFuncState::AddInstruction(pSVar3,_OP_JMP,0,-0x4d2,0,0);
  local_18 = (ulong)((this->_fs->_instructions)._size - 1);
  sqvector<long,_unsigned_int>::push_back(&this->_fs->_unresolvedcontinues,(long *)&local_18);
  return;
}

Assistant:

void CodegenVisitor::visitContinueStatement(ContinueStatement *continueStmt) {
    addLineNumber(continueStmt);
    if (_fs->_continuetargets.size() <= 0)
        reportDiagnostic(continueStmt, DiagnosticsId::DI_LOOP_CONTROLLER_NOT_IN_LOOP, "continue");
    if (_fs->_continuetargets.top() > 0) {
        _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
    }
    RESOLVE_OUTERS();
    _fs->AddInstruction(_OP_JMP, 0, -1234);
    _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
}